

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall
Json::Path::addPathInArg(Path *this,string *path,InArgs *in,const_iterator *itInArg,Kind kind)

{
  bool bVar1;
  reference ppPVar2;
  __normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
  local_38;
  Kind local_2c;
  const_iterator *pcStack_28;
  Kind kind_local;
  const_iterator *itInArg_local;
  InArgs *in_local;
  string *path_local;
  Path *this_local;
  
  local_2c = kind;
  pcStack_28 = itInArg;
  itInArg_local = (const_iterator *)in;
  in_local = (InArgs *)path;
  path_local = (string *)this;
  local_38._M_current =
       (PathArgument **)
       std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::end(in)
  ;
  bVar1 = __gnu_cxx::operator==(itInArg,&local_38);
  if ((!bVar1) &&
     (ppPVar2 = __gnu_cxx::
                __normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
                ::operator*(pcStack_28), (*ppPVar2)->kind_ == local_2c)) {
    ppPVar2 = __gnu_cxx::
              __normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
              ::operator*(pcStack_28);
    std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
              (&this->args_,*ppPVar2);
  }
  return;
}

Assistant:

void 
Path::addPathInArg( const std::string &path, 
                    const InArgs &in, 
                    InArgs::const_iterator &itInArg, 
                    PathArgument::Kind kind )
{
   if ( itInArg == in.end() )
   {
      // Error: missing argument %d
   }
   else if ( (*itInArg)->kind_ != kind )
   {
      // Error: bad argument type
   }
   else
   {
      args_.push_back( **itInArg );
   }
}